

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     handle_cstring_type_spec<char,fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<wchar_t>,fmt::v6::internal::error_handler>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  char in_DIL;
  error_handler *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  
  if ((in_DIL == '\0') || (in_DIL == 's')) {
    arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::
    cstring_spec_handler::on_string((cstring_spec_handler *)0x210a9e);
  }
  else {
    if (in_DIL != 'p') {
      error_handler::on_error(unaff_retaddr,(char *)CONCAT17(in_DIL,in_stack_fffffffffffffff8));
    }
    arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::
    cstring_spec_handler::on_pointer((cstring_spec_handler *)0x210ab4);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}